

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::InputFile::Data::lockedSetFrameBuffer(Data *this,FrameBuffer *frameBuffer)

{
  PixelType PVar1;
  long lVar2;
  size_t xst;
  bool bVar3;
  uint uVar4;
  int iVar5;
  char *__s2;
  ostream *poVar6;
  char *pcVar7;
  ArgExc *this_00;
  Slice *pSVar8;
  pointer pcVar9;
  Data *in_RDI;
  exr_attr_box2i_t eVar10;
  uint64_t tilebytes;
  uint64_t offset;
  uint64_t bytes;
  Slice s;
  ConstIterator k;
  stringstream _iex_throw_s;
  uint64_t tileRowSize;
  exr_attr_box2i_t dataWindow;
  int partidx;
  ConstIterator j;
  ConstIterator i;
  FrameBuffer *oldFrameBuffer;
  undefined4 in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  *in_stack_fffffffffffffca0;
  size_t in_stack_fffffffffffffca8;
  bool local_2cd;
  bool local_2b9;
  Slice local_2a8;
  long local_268;
  long local_260;
  size_t local_258;
  PixelType local_250 [10];
  double local_228;
  const_iterator local_218;
  const_iterator local_210;
  stringstream local_1f8 [16];
  ostream local_1e8 [24];
  Context *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe4c;
  TiledInputFile *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe5c;
  Context *in_stack_fffffffffffffe60;
  FrameBuffer *in_stack_fffffffffffffeb8;
  CompositeDeepScanLine *in_stack_fffffffffffffec0;
  FrameBuffer *in_stack_fffffffffffffef8;
  ScanLineInputFile *in_stack_ffffffffffffff00;
  Slice *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  FrameBuffer *in_stack_ffffffffffffff40;
  int local_64;
  int local_5c;
  
  if (in_RDI->_storage == EXR_STORAGE_TILED) {
    FrameBuffer::begin((FrameBuffer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88))
    ;
    FrameBuffer::begin((FrameBuffer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88))
    ;
    while( true ) {
      FrameBuffer::end((FrameBuffer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88))
      ;
      bVar3 = Imf_3_4::operator!=((ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                  (ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      local_2b9 = false;
      if (bVar3) {
        FrameBuffer::end((FrameBuffer *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        local_2b9 = Imf_3_4::operator!=((ConstIterator *)
                                        CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90
                                                ),
                                        (ConstIterator *)
                                        CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88
                                                ));
      }
      if (local_2b9 == false) break;
      pcVar7 = FrameBuffer::ConstIterator::name((ConstIterator *)0x1f67bb);
      __s2 = FrameBuffer::ConstIterator::name((ConstIterator *)0x1f67d0);
      iVar5 = strcmp(pcVar7,__s2);
      if (iVar5 != 0) break;
      pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x1f67f2);
      PVar1 = pSVar8->type;
      pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x1f6808);
      if (PVar1 != pSVar8->type) break;
      FrameBuffer::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      FrameBuffer::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    }
    FrameBuffer::end((FrameBuffer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    bVar3 = Imf_3_4::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    local_2cd = true;
    if (!bVar3) {
      FrameBuffer::end((FrameBuffer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88))
      ;
      local_2cd = Imf_3_4::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                      (ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88))
      ;
    }
    if (local_2cd != false) {
      deleteCachedBuffer((Data *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      std::make_unique<Imf_3_4::FrameBuffer>();
      std::unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>::operator=
                ((unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_> *)
                 CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 (unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_> *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      std::unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>::~unique_ptr
                ((unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_> *)
                 CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      getPartIdx(in_RDI);
      eVar10 = Context::dataWindow(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      local_64 = eVar10.min.x;
      in_RDI->_cachedOffset = local_64;
      std::unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>::
      operator->((unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
                  *)0x1f6951);
      uVar4 = TiledInputFile::tileYSize((TiledInputFile *)0x1f6959);
      local_5c = eVar10.max.x;
      getPartIdx(in_RDI);
      bVar3 = Context::chunkTableValid
                        ((Context *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                         in_stack_fffffffffffffc8c);
      if (!bVar3) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1f8);
        poVar6 = std::operator<<(local_1e8,
                                 "Unable to use generic API to read with (partially?) corrupt chunk table in "
                                );
        pcVar7 = Context::fileName(in_stack_fffffffffffffe30);
        poVar6 = std::operator<<(poVar6,pcVar7);
        poVar6 = std::operator<<(poVar6,", part ");
        iVar5 = getPartIdx(in_RDI);
        std::ostream::operator<<(poVar6,iVar5);
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,local_1f8);
        __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      local_210._M_node =
           (_Base_ptr)
           FrameBuffer::begin((FrameBuffer *)
                              CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      while( true ) {
        local_218._M_node =
             (_Base_ptr)
             FrameBuffer::end((FrameBuffer *)
                              CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        bVar3 = Imf_3_4::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        if (!bVar3) break;
        pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x1f6b3a);
        memcpy(local_250,pSVar8,0x38);
        FrameBuffer::ConstIterator::name((ConstIterator *)0x1f6b78);
        bVar3 = Context::hasChannel((Context *)
                                    CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                    in_stack_fffffffffffffc8c,(char *)0x1f6b89);
        if (bVar3) {
          local_258 = (ulong)(local_250[0] != HALF) * 2 + 2;
          local_260 = local_258 * (long)in_RDI->_cachedOffset;
          local_268 = local_258 * (ulong)uVar4 * (((long)local_5c - (long)local_64) + 1);
          std::make_unique<char[]>(in_stack_fffffffffffffca8);
          std::
          vector<std::unique_ptr<char[],std::default_delete<char[]>>,std::allocator<std::unique_ptr<char[],std::default_delete<char[]>>>>
          ::emplace_back<std::unique_ptr<char[],std::default_delete<char[]>>>
                    (in_stack_fffffffffffffca0,
                     (unique_ptr<char[],_std::default_delete<char[]>_> *)
                     CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
          std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                    ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffffca0);
          std::unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>::
          operator->((unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_> *
                     )0x1f6c45);
          FrameBuffer::ConstIterator::name((ConstIterator *)0x1f6c57);
          PVar1 = local_250[0];
          std::
          vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
          ::back((vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
          pcVar9 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                             ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                              CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
          xst = local_258;
          lVar2 = -local_260;
          in_stack_fffffffffffffca8 = local_258;
          std::unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>::
          operator->((unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
                      *)0x1f6cc0);
          iVar5 = TiledInputFile::levelWidth(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          in_stack_fffffffffffffc88 = 1;
          in_stack_fffffffffffffc90 = 0;
          in_stack_fffffffffffffc98 = 1;
          Slice::Slice(&local_2a8,PVar1,pcVar9 + lVar2,xst,in_stack_fffffffffffffca8 * (long)iVar5,1
                       ,1,local_228,false,true);
          FrameBuffer::insert(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                              in_stack_ffffffffffffff30);
        }
        FrameBuffer::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      }
    }
    FrameBuffer::operator=
              ((FrameBuffer *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (FrameBuffer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  }
  else if ((in_RDI->_storage == EXR_STORAGE_DEEP_SCANLINE) ||
          (in_RDI->_storage == EXR_STORAGE_DEEP_TILED)) {
    bVar3 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
                        *)0x1f6dbb);
    if (!bVar3) {
      std::make_unique<Imf_3_4::CompositeDeepScanLine>();
      std::
      unique_ptr<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
      ::operator=((unique_ptr<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
                   *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                  (unique_ptr<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
                   *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      std::
      unique_ptr<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
      ::~unique_ptr((unique_ptr<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
                     *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    }
    std::
    unique_ptr<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
    ::operator->((unique_ptr<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
                  *)0x1f6e03);
    CompositeDeepScanLine::setFrameBuffer(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  else {
    std::unique_ptr<Imf_3_4::ScanLineInputFile,_std::default_delete<Imf_3_4::ScanLineInputFile>_>::
    operator->((unique_ptr<Imf_3_4::ScanLineInputFile,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
                *)0x1f6e26);
    ScanLineInputFile::setFrameBuffer(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    FrameBuffer::operator=
              ((FrameBuffer *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (FrameBuffer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  }
  return;
}

Assistant:

void
InputFile::Data::lockedSetFrameBuffer (const FrameBuffer& frameBuffer)
{
    if (_storage == EXR_STORAGE_TILED)
    {
        //
        // We must invalidate the cached buffer if the new frame
        // buffer has a different set of channels than the old
        // frame buffer, or if the type of a channel has changed.
        //

        const FrameBuffer& oldFrameBuffer = _cacheFrameBuffer;

        FrameBuffer::ConstIterator i = oldFrameBuffer.begin ();
        FrameBuffer::ConstIterator j = frameBuffer.begin ();

        while (i != oldFrameBuffer.end () && j != frameBuffer.end ())
        {
            if (strcmp (i.name (), j.name ()) ||
                i.slice ().type != j.slice ().type)
                break;

            ++i;
            ++j;
        }

        if (i != oldFrameBuffer.end () || j != frameBuffer.end ())
        {
            //
            // Invalidate the cached buffer.
            //
            deleteCachedBuffer ();

            //
            // Create new a cached frame buffer.  It can hold a single
            // row of tiles.  The cached buffer can be reused for each
            // row of tiles because we set the yTileCoords parameter of
            // each Slice to true.
            //

            _cachedBuffer               = std::make_unique<FrameBuffer> ();
            int              partidx    = getPartIdx ();
            exr_attr_box2i_t dataWindow = _ctxt->dataWindow (partidx);
            _cachedOffset               = dataWindow.min.x;

            uint64_t tileRowSize =
                static_cast<uint64_t> (_tFile->tileYSize ()) *
                static_cast<uint64_t> (
                    static_cast<int64_t> (dataWindow.max.x) -
                    static_cast<int64_t> (dataWindow.min.x) +
                    1LL );

            // before we allocate a (potentially large) chunk of ram, let's
            // quick ensure we can read the tiles
            if (!_ctxt->chunkTableValid (getPartIdx ()))
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Unable to use generic API to read with (partially?) corrupt chunk table in "
                    << _ctxt->fileName () << ", part " << getPartIdx () );
            }

            for (FrameBuffer::ConstIterator k = frameBuffer.begin ();
                 k != frameBuffer.end ();
                 ++k)
            {
                Slice s = k.slice ();

                //
                // omit adding channels that are not listed - 'fill' channels are added later
                //
                if (_ctxt->hasChannel (partidx, k.name ()))
                {
                    uint64_t bytes = (s.type == OPENEXR_IMF_INTERNAL_NAMESPACE::HALF) ? 2 : 4;
                    uint64_t offset = bytes * _cachedOffset;
                    uint64_t tilebytes = bytes * tileRowSize;

                    _slicePointers.emplace_back (std::make_unique<char[]> (tilebytes));

                    _cachedBuffer->insert (
                        k.name (),
                        Slice (
                            s.type,
                            _slicePointers.back ().get() - offset,
                            bytes,
                            bytes * _tFile->levelWidth (0),
                            1,
                            1,
                            s.fillValue,
                            false,
                            true));
                }
            }
        }

        _cacheFrameBuffer = frameBuffer;
    }
    else if (
        _storage == EXR_STORAGE_DEEP_SCANLINE ||
        _storage == EXR_STORAGE_DEEP_TILED)
    {
        if (!_compositor)
            _compositor = std::make_unique<CompositeDeepScanLine> ();
        _compositor->setFrameBuffer (frameBuffer);
    }
    else
    {
        _sFile->setFrameBuffer (frameBuffer);
        _cacheFrameBuffer = frameBuffer;
    }
}